

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O1

bool picojson::
     _parse_string<std::__cxx11::string,std::istreambuf_iterator<char,std::char_traits<char>>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out,
               input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *in)

{
  byte in_AL;
  bool bVar1;
  byte bVar2;
  int iVar3;
  FILE *__stream;
  FILE *__stream_00;
  
  __stream_00 = (FILE *)in;
  do {
    iVar3 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::getc(in,__stream_00);
    if (iVar3 < 0x20) {
      input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::ungetc
                (in,(int)__stream_00,__stream);
LAB_00117525:
      bVar2 = 0;
LAB_0011755e:
      bVar1 = false;
    }
    else {
      if (iVar3 == 0x22) {
        bVar2 = 1;
        goto LAB_0011755e;
      }
      if (iVar3 != 0x5c) goto LAB_001175af;
      iVar3 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::getc(in,__stream_00);
      bVar2 = 0;
      if (iVar3 < 0x62) {
        if (iVar3 == 0x22) {
          iVar3 = 0x22;
        }
        else if (iVar3 == 0x2f) {
          iVar3 = 0x2f;
        }
        else {
          bVar1 = false;
          bVar2 = 0;
          if (iVar3 != 0x5c) goto switchD_00117573_caseD_6f;
          iVar3 = 0x5c;
        }
        goto LAB_001175af;
      }
      bVar1 = false;
      switch(iVar3) {
      case 0x6e:
        iVar3 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
        goto switchD_00117573_caseD_6f;
      case 0x72:
        iVar3 = 0xd;
        break;
      case 0x74:
        iVar3 = 9;
        break;
      case 0x75:
        __stream_00 = (FILE *)in;
        bVar1 = _parse_codepoint<std::__cxx11::string,std::istreambuf_iterator<char,std::char_traits<char>>>
                          (out,in);
        if (!bVar1) goto LAB_00117525;
        goto LAB_001175ba;
      default:
        if (iVar3 == 0x62) {
          iVar3 = 8;
        }
        else {
          bVar1 = false;
          if (iVar3 != 0x66) goto switchD_00117573_caseD_6f;
          iVar3 = 0xc;
        }
      }
LAB_001175af:
      __stream_00 = (FILE *)(ulong)(uint)(int)(char)iVar3;
      std::__cxx11::string::push_back((char)out);
LAB_001175ba:
      bVar1 = true;
      bVar2 = in_AL;
    }
switchD_00117573_caseD_6f:
    in_AL = bVar2;
    if (!bVar1) {
      return (bool)(bVar2 & 1);
    }
  } while( true );
}

Assistant:

inline bool _parse_string(String& out, input<Iter>& in) {
    while (1) {
      int ch = in.getc();
      if (ch < ' ') {
    in.ungetc();
    return false;
      } else if (ch == '"') {
    return true;
      } else if (ch == '\\') {
    if ((ch = in.getc()) == -1) {
      return false;
    }
    switch (ch) {
#define MAP(sym, val) case sym: out.push_back(val); break
      MAP('"', '\"');
      MAP('\\', '\\');
      MAP('/', '/');
      MAP('b', '\b');
      MAP('f', '\f');
      MAP('n', '\n');
      MAP('r', '\r');
      MAP('t', '\t');
#undef MAP
    case 'u':
      if (! _parse_codepoint(out, in)) {
        return false;
      }
      break;
    default:
      return false;
    }
      } else {
    out.push_back(ch);
      }
    }
    return false;
  }